

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

size_t __thiscall rangeless::fn::impl::chunker::operator()(chunker *this,X *param_1)

{
  ulong uVar1;
  X *param_1_local;
  chunker *this_local;
  
  uVar1 = this->n_calls + 1;
  this->n_calls = uVar1;
  return (uVar1 >> 1) / this->chunk_size;
}

Assistant:

size_t operator()(const T&) const
        {
            // chunker is called with group_adjacent_by.
            // If we had one call to key_fn per element, 
            // we could chunk in groups of 10 like
            // elems % fn::group_adjacent_by([n = 0UL](const auto){ return n++/10; });
            //
            // in group_adjacent_by we call the key_fn 2*(n-1) times.
            return ++n_calls/2/chunk_size;
        }